

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::LSTMWeightParams::Clear(LSTMWeightParams *this)

{
  if (this->inputgateweightmatrix_ != (WeightParams *)0x0) {
    (*(this->inputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->inputgateweightmatrix_ = (WeightParams *)0x0;
  if (this->forgetgateweightmatrix_ != (WeightParams *)0x0) {
    (*(this->forgetgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->forgetgateweightmatrix_ = (WeightParams *)0x0;
  if (this->blockinputweightmatrix_ != (WeightParams *)0x0) {
    (*(this->blockinputweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->blockinputweightmatrix_ = (WeightParams *)0x0;
  if (this->outputgateweightmatrix_ != (WeightParams *)0x0) {
    (*(this->outputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  if (this->inputgaterecursionmatrix_ != (WeightParams *)0x0) {
    (*(this->inputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->inputgaterecursionmatrix_ = (WeightParams *)0x0;
  if (this->forgetgaterecursionmatrix_ != (WeightParams *)0x0) {
    (*(this->forgetgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->forgetgaterecursionmatrix_ = (WeightParams *)0x0;
  if (this->blockinputrecursionmatrix_ != (WeightParams *)0x0) {
    (*(this->blockinputrecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->blockinputrecursionmatrix_ = (WeightParams *)0x0;
  if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0) {
    (*(this->outputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  if (this->inputgatebiasvector_ != (WeightParams *)0x0) {
    (*(this->inputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->inputgatebiasvector_ = (WeightParams *)0x0;
  if (this->forgetgatebiasvector_ != (WeightParams *)0x0) {
    (*(this->forgetgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->forgetgatebiasvector_ = (WeightParams *)0x0;
  if (this->blockinputbiasvector_ != (WeightParams *)0x0) {
    (*(this->blockinputbiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->blockinputbiasvector_ = (WeightParams *)0x0;
  if (this->outputgatebiasvector_ != (WeightParams *)0x0) {
    (*(this->outputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  if (this->inputgatepeepholevector_ != (WeightParams *)0x0) {
    (*(this->inputgatepeepholevector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->inputgatepeepholevector_ = (WeightParams *)0x0;
  if (this->forgetgatepeepholevector_ != (WeightParams *)0x0) {
    (*(this->forgetgatepeepholevector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->forgetgatepeepholevector_ = (WeightParams *)0x0;
  if (this->outputgatepeepholevector_ != (WeightParams *)0x0) {
    (*(this->outputgatepeepholevector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgatepeepholevector_ = (WeightParams *)0x0;
  return;
}

Assistant:

void LSTMWeightParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LSTMWeightParams)
  if (GetArenaNoVirtual() == NULL && inputgateweightmatrix_ != NULL) {
    delete inputgateweightmatrix_;
  }
  inputgateweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && forgetgateweightmatrix_ != NULL) {
    delete forgetgateweightmatrix_;
  }
  forgetgateweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && blockinputweightmatrix_ != NULL) {
    delete blockinputweightmatrix_;
  }
  blockinputweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgateweightmatrix_ != NULL) {
    delete outputgateweightmatrix_;
  }
  outputgateweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && inputgaterecursionmatrix_ != NULL) {
    delete inputgaterecursionmatrix_;
  }
  inputgaterecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && forgetgaterecursionmatrix_ != NULL) {
    delete forgetgaterecursionmatrix_;
  }
  forgetgaterecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && blockinputrecursionmatrix_ != NULL) {
    delete blockinputrecursionmatrix_;
  }
  blockinputrecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgaterecursionmatrix_ != NULL) {
    delete outputgaterecursionmatrix_;
  }
  outputgaterecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && inputgatebiasvector_ != NULL) {
    delete inputgatebiasvector_;
  }
  inputgatebiasvector_ = NULL;
  if (GetArenaNoVirtual() == NULL && forgetgatebiasvector_ != NULL) {
    delete forgetgatebiasvector_;
  }
  forgetgatebiasvector_ = NULL;
  if (GetArenaNoVirtual() == NULL && blockinputbiasvector_ != NULL) {
    delete blockinputbiasvector_;
  }
  blockinputbiasvector_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgatebiasvector_ != NULL) {
    delete outputgatebiasvector_;
  }
  outputgatebiasvector_ = NULL;
  if (GetArenaNoVirtual() == NULL && inputgatepeepholevector_ != NULL) {
    delete inputgatepeepholevector_;
  }
  inputgatepeepholevector_ = NULL;
  if (GetArenaNoVirtual() == NULL && forgetgatepeepholevector_ != NULL) {
    delete forgetgatepeepholevector_;
  }
  forgetgatepeepholevector_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgatepeepholevector_ != NULL) {
    delete outputgatepeepholevector_;
  }
  outputgatepeepholevector_ = NULL;
}